

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparator.cc
# Opt level: O3

void __thiscall
leveldb::anon_unknown_2::BytewiseComparatorImpl::FindShortSuccessor
          (BytewiseComparatorImpl *this,string *key)

{
  char cVar1;
  long lVar2;
  pointer pcVar3;
  size_type __n;
  byte bVar4;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (key->_M_string_length != 0) {
    pcVar3 = (key->_M_dataplus)._M_p;
    __n = 1;
    do {
      cVar1 = pcVar3[__n - 1];
      if (cVar1 != -1) {
        bVar4 = cVar1 + 1;
        this = (BytewiseComparatorImpl *)(ulong)bVar4;
        pcVar3[__n - 1] = bVar4;
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                    (key,__n,'\0');
          return;
        }
        goto LAB_006535a3;
      }
      this = (BytewiseComparatorImpl *)((__n - key->_M_string_length) + 1);
      __n = __n + 1;
    } while (this != (BytewiseComparatorImpl *)0x1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
LAB_006535a3:
  __stack_chk_fail(this);
}

Assistant:

void FindShortSuccessor(std::string* key) const override {
    // Find first character that can be incremented
    size_t n = key->size();
    for (size_t i = 0; i < n; i++) {
      const uint8_t byte = (*key)[i];
      if (byte != static_cast<uint8_t>(0xff)) {
        (*key)[i] = byte + 1;
        key->resize(i + 1);
        return;
      }
    }
    // *key is a run of 0xffs.  Leave it alone.
  }